

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# striped_unwind.c
# Opt level: O2

int * parasail_striped_unwind_32(int lena,int lenb,int segWidth,void *array_)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  piVar4 = (int *)malloc((long)lena * (long)lenb * 4);
  iVar2 = (segWidth + lena + -1) / segWidth;
  uVar3 = iVar2 * segWidth;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  uVar9 = (ulong)(uint)lenb;
  if (lenb < 1) {
    uVar9 = uVar7;
  }
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      iVar5 = (int)((long)uVar1 % (long)segWidth) * iVar2 + (int)((long)uVar1 / (long)segWidth);
      if (iVar5 < lena) {
        piVar4[uVar7 + (long)(iVar5 * lenb)] = *(int *)((long)array_ + uVar6 * 4);
      }
    }
    array_ = (void *)((long)array_ + (long)(int)uVar3 * 4);
  }
  return piVar4;
}

Assistant:

static inline int* CONCAT(parasail_striped_unwind_, T) (
        int lena,
        int lenb,
        int segWidth,
        void *array_)
{
    int i;
    int j;
    int *ret = (int*)malloc(sizeof(int)*lena*lenb);
    D *array = (D*)array_;
    const int32_t segLen = (lena + segWidth - 1) / segWidth;
    int32_t column_len = segLen * segWidth;
    for (j=0; j<lenb; ++j) {
        for (i=0; i<column_len; ++i) {
            int32_t i_unwound = i / segWidth + i % segWidth * segLen;
            if (i_unwound < lena) {
                ret[i_unwound*lenb + j] = (int)array[j*column_len + i];
            }
        }
    }
    return ret;
}